

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

void __thiscall jsonnet::internal::anon_unknown_0::Stack::~Stack(Stack *this)

{
  pointer pFVar1;
  pointer this_00;
  
  this->_vptr_Stack = (_func_int **)&PTR_dump_00237630;
  this_00 = (this->stack).
            super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (this->stack).
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pFVar1) {
    do {
      Frame::~Frame(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pFVar1);
    this_00 = (this->stack).
              super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (this_00 != (pointer)0x0) {
    operator_delete(this_00,(long)(this->stack).
                                  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)this_00
                   );
    return;
  }
  return;
}

Assistant:

~Stack(void) {}